

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_encode_utils.cpp
# Opt level: O2

string * encode_compute_md5_abi_cxx11_(string *__return_storage_ptr__,char *buf,int len)

{
  mbedtls_md_info_t *md_info;
  allocator<char> local_461;
  size_t output_len;
  mbedtls_md_context_t ctx;
  char encoded [512];
  char output [512];
  
  memset(output,0,0x200);
  memset(encoded,0,0x200);
  ctx.md_info = (mbedtls_md_info_t *)0x0;
  ctx.md_ctx = (void *)0x0;
  ctx.hmac_ctx = (void *)0x0;
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);
  mbedtls_md_init_ctx(&ctx,md_info);
  mbedtls_md_update(&ctx,(uchar *)buf,(long)len);
  mbedtls_md_finish(&ctx,(uchar *)encoded);
  mbedtls_base64_encode((uchar *)output,0x200,&output_len,(uchar *)encoded,0x10);
  mbedtls_md_free(&ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,output,&local_461);
  return __return_storage_ptr__;
}

Assistant:

std::string encode_compute_md5(char* buf, int len) {
  size_t output_len;
  char output[512] = {};
  char encoded[512] = {};
  mbedtls_md_context_t ctx= {};
  const mbedtls_md_info_t* md5_md = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);

  mbedtls_md_init_ctx(&ctx, md5_md);
  mbedtls_md_update(&ctx, (const unsigned char*)buf, len);
  mbedtls_md_finish(&ctx, (unsigned char*)encoded);

  mbedtls_base64_encode((unsigned char*)output, sizeof(output), &output_len, (const unsigned char*)encoded, 16);
  mbedtls_md_free(&ctx);
  return output;
}